

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

void duckdb::SortedAggregateFunction::ScatterUpdate
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,Vector *states,
               idx_t count)

{
  SortedAggregateBindData *order_bind;
  sel_t *psVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  size_type __n;
  reference pvVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  idx_t iVar7;
  idx_t i_1;
  idx_t iVar8;
  vector<unsigned_int,_true> sel_data;
  UnifiedVectorFormat svdata;
  DataChunk sort_inputs;
  DataChunk arg_inputs;
  allocator_type local_121;
  long local_120;
  AggregateInputData *local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  UnifiedVectorFormat local_f8;
  DataChunk local_b0;
  DataChunk local_70;
  
  if (count != 0) {
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
    order_bind = (SortedAggregateBindData *)(aggr_input_data->bind_data).ptr;
    DataChunk::DataChunk(&local_70);
    DataChunk::DataChunk(&local_b0);
    ProjectInputs(inputs,order_bind,input_count,count,&local_70,&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(states,count,&local_f8);
    psVar1 = (local_f8.sel)->sel_vector;
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if (psVar1 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar1[uVar5];
      }
      *(long *)(*(long *)(local_f8.data + uVar4 * 8) + 0x80) =
           *(long *)(*(long *)(local_f8.data + uVar4 * 8) + 0x80) + 1;
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
    local_118 = aggr_input_data;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_110,count,&local_121);
    local_120 = 0;
    iVar8 = 0;
    do {
      iVar7 = iVar8;
      if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)(local_f8.sel)->sel_vector[iVar8];
      }
      lVar2 = *(long *)(local_f8.data + iVar7 * 8);
      if (*(long *)(lVar2 + 0x88) == 0) {
        *(long *)(lVar2 + 0x88) = local_120;
        puVar6 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + local_120;
        *(undefined8 *)(lVar2 + 0x70) = 0;
        this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x78);
        *(undefined8 *)(lVar2 + 0x78) = 0;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        *(pointer *)(lVar2 + 0x68) = puVar6;
        local_120 = local_120 + *(long *)(lVar2 + 0x80);
      }
      __n = *(size_type *)(lVar2 + 0x88);
      *(size_type *)(lVar2 + 0x88) = __n + 1;
      pvVar3 = vector<unsigned_int,_true>::operator[]((vector<unsigned_int,_true> *)&local_110,__n);
      *pvVar3 = (value_type)iVar7;
      iVar8 = iVar8 + 1;
    } while (count != iVar8);
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_f8.sel)->sel_vector[uVar5];
      }
      if ((*(SortedAggregateState **)(local_f8.data + uVar4 * 8))->nsel != 0) {
        SortedAggregateState::UpdateSlice
                  (*(SortedAggregateState **)(local_f8.data + uVar4 * 8),local_118,&local_b0,
                   &local_70);
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
    if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    DataChunk::~DataChunk(&local_b0);
    DataChunk::~DataChunk(&local_70);
  }
  return;
}

Assistant:

static void ScatterUpdate(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, Vector &states,
	                          idx_t count) {
		if (!count) {
			return;
		}

		// Append the arguments to the two sub-collections
		const auto &order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		DataChunk arg_inputs;
		DataChunk sort_inputs;
		ProjectInputs(inputs, order_bind, input_count, count, arg_inputs, sort_inputs);

		// We have to scatter the chunks one at a time
		// so build a selection vector for each one.
		UnifiedVectorFormat svdata;
		states.ToUnifiedFormat(count, svdata);

		// Size the selection vector for each state.
		auto sdata = UnifiedVectorFormat::GetDataNoConst<SortedAggregateState *>(svdata);
		for (idx_t i = 0; i < count; ++i) {
			auto sidx = svdata.sel->get_index(i);
			auto order_state = sdata[sidx];
			order_state->nsel++;
		}

		// Build the selection vector for each state.
		vector<sel_t> sel_data(count);
		idx_t start = 0;
		for (idx_t i = 0; i < count; ++i) {
			auto sidx = svdata.sel->get_index(i);
			auto order_state = sdata[sidx];
			if (!order_state->offset) {
				//	First one
				order_state->offset = start;
				order_state->sel.Initialize(sel_data.data() + order_state->offset);
				start += order_state->nsel;
			}
			sel_data[order_state->offset++] = UnsafeNumericCast<sel_t>(sidx);
		}

		// Append nonempty slices to the arguments
		for (idx_t i = 0; i < count; ++i) {
			auto sidx = svdata.sel->get_index(i);
			auto order_state = sdata[sidx];
			if (!order_state->nsel) {
				continue;
			}

			order_state->UpdateSlice(aggr_input_data, sort_inputs, arg_inputs);
		}
	}